

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseExtensions
          (Parser *this,DescriptorProto *message,LocationRecorder *extensions_location,
          FileDescriptorProto *containing_file)

{
  size_type *this_00;
  bool bVar1;
  int iVar2;
  DescriptorProto_ExtensionRange *descriptor;
  Type *pTVar3;
  ExtensionRangeOptions *from;
  ExtensionRangeOptions *this_01;
  Type *pTVar4;
  SourceCodeInfo_Location *this_02;
  int32_t value;
  ulong uVar5;
  int iVar6;
  int j;
  int iVar7;
  int start;
  LocationRecorder *local_d0;
  ulong local_c8;
  RepeatedPtrFieldBase *local_c0;
  int local_b4;
  LocationRecorder start_location;
  LocationRecorder location;
  Token start_token;
  
  local_d0 = extensions_location;
  bVar1 = Consume(this,"extensions");
  if (bVar1) {
    local_c8 = (ulong)(uint)(message->extension_range_).super_RepeatedPtrFieldBase.current_size_;
    local_c0 = &(message->extension_range_).super_RepeatedPtrFieldBase;
    do {
      LocationRecorder::LocationRecorder
                (&location,local_d0,
                 (message->extension_range_).super_RepeatedPtrFieldBase.current_size_);
      descriptor = RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::Add
                             ((RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)
                              local_c0);
      LocationRecorder::RecordLegacyLocation(&location,&descriptor->super_Message,NUMBER);
      start_token.text._M_dataplus._M_p = (pointer)&start_token.text.field_2;
      start_token.text._M_string_length = 0;
      start_token.text.field_2._M_allocated_capacity._0_4_ =
           start_token.text.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      LocationRecorder::LocationRecorder(&start_location,&location,1);
      io::Tokenizer::Token::operator=(&start_token,&this->input_->current_);
      bVar1 = ConsumeInteger(this,&start,"Expected field number range.");
      LocationRecorder::~LocationRecorder(&start_location);
      if (!bVar1) {
LAB_0035079b:
        std::__cxx11::string::~string((string *)&start_token.text);
        LocationRecorder::~LocationRecorder(&location);
        return false;
      }
      bVar1 = TryConsume(this,"to");
      if (bVar1) {
        LocationRecorder::LocationRecorder(&start_location,&location,2);
        bVar1 = TryConsume(this,"max");
        iVar7 = -2;
        if ((!bVar1) &&
           (bVar1 = ConsumeInteger(this,&local_b4,"Expected integer."), iVar7 = local_b4, !bVar1)) {
          LocationRecorder::~LocationRecorder(&start_location);
          goto LAB_0035079b;
        }
        LocationRecorder::~LocationRecorder(&start_location);
        iVar6 = start;
      }
      else {
        LocationRecorder::LocationRecorder(&start_location,&location,2);
        LocationRecorder::StartAt(&start_location,&start_token);
        LocationRecorder::EndAt(&start_location,&start_token);
        iVar6 = start;
        LocationRecorder::~LocationRecorder(&start_location);
        iVar7 = iVar6;
      }
      descriptor->start_ = iVar6;
      *(byte *)(descriptor->_has_bits_).has_bits_ = (byte)(descriptor->_has_bits_).has_bits_[0] | 6;
      descriptor->end_ = iVar7 + 1;
      std::__cxx11::string::~string((string *)&start_token.text);
      LocationRecorder::~LocationRecorder(&location);
      bVar1 = TryConsume(this,",");
    } while (bVar1);
    bVar1 = LookingAt(this,"[");
    if (!bVar1) {
LAB_0035084e:
      bVar1 = ConsumeEndOfDeclaration(this,";",local_d0);
      return bVar1;
    }
    iVar6 = (local_d0->location_->path_).current_size_;
    SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)&start_token);
    pTVar3 = internal::RepeatedPtrFieldBase::
             Mutable<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                       (local_c0,(int)local_c8);
    from = DescriptorProto_ExtensionRange::_internal_mutable_options(pTVar3);
    LocationRecorder::LocationRecorder(&location,local_d0,0,(SourceCodeInfo *)&start_token);
    LocationRecorder::LocationRecorder(&start_location,&location,3);
    bVar1 = Consume(this,"[");
    if (bVar1) {
      do {
        bVar1 = ParseOption(this,&from->super_Message,&start_location,containing_file,
                            OPTION_ASSIGNMENT);
        if (!bVar1) goto LAB_00350771;
        bVar1 = TryConsume(this,",");
      } while (bVar1);
      bVar1 = Consume(this,"]");
      LocationRecorder::~LocationRecorder(&start_location);
      LocationRecorder::~LocationRecorder(&location);
      if (bVar1) {
        iVar7 = (int)local_c8;
        while( true ) {
          iVar7 = iVar7 + 1;
          iVar2 = (message->extension_range_).super_RepeatedPtrFieldBase.current_size_;
          if (iVar2 <= iVar7) break;
          pTVar3 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                             (local_c0,iVar7);
          this_01 = DescriptorProto_ExtensionRange::_internal_mutable_options(pTVar3);
          ExtensionRangeOptions::CopyFrom(this_01,from);
        }
        this_00 = &start_token.text._M_string_length;
        uVar5 = local_c8;
        while (value = (int32_t)uVar5, value < iVar2) {
          for (iVar7 = 0; iVar7 < (int)start_token.text.field_2._M_allocated_capacity._0_4_;
              iVar7 = iVar7 + 1) {
            pTVar4 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                               ((RepeatedPtrFieldBase *)this_00,iVar7);
            if ((pTVar4->path_).current_size_ != iVar6 + 1) {
              this_02 = RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::Add
                                  (&this->source_code_info_->location_);
              pTVar4 = internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                                 ((RepeatedPtrFieldBase *)this_00,iVar7);
              SourceCodeInfo_Location::CopyFrom(this_02,pTVar4);
              SourceCodeInfo_Location::set_path(this_02,iVar6,value);
            }
          }
          iVar2 = (message->extension_range_).super_RepeatedPtrFieldBase.current_size_;
          uVar5 = (ulong)(value + 1);
        }
        SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)&start_token);
        goto LAB_0035084e;
      }
    }
    else {
LAB_00350771:
      LocationRecorder::~LocationRecorder(&start_location);
      LocationRecorder::~LocationRecorder(&location);
    }
    SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)&start_token);
  }
  return false;
}

Assistant:

bool Parser::ParseExtensions(DescriptorProto* message,
                             const LocationRecorder& extensions_location,
                             const FileDescriptorProto* containing_file) {
  // Parse the declaration.
  DO(Consume("extensions"));

  int old_range_size = message->extension_range_size();

  do {
    // Note that kExtensionRangeFieldNumber was already pushed by the parent.
    LocationRecorder location(extensions_location,
                              message->extension_range_size());

    DescriptorProto::ExtensionRange* range = message->add_extension_range();
    location.RecordLegacyLocation(range,
                                  DescriptorPool::ErrorCollector::NUMBER);

    int start, end;
    io::Tokenizer::Token start_token;

    {
      LocationRecorder start_location(
          location, DescriptorProto::ExtensionRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, "Expected field number range."));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
  } while (TryConsume(","));

  if (LookingAt("[")) {
    int range_number_index = extensions_location.CurrentPathSize();
    SourceCodeInfo info;

    // Parse extension range options in the first range.
    ExtensionRangeOptions* options =
        message->mutable_extension_range(old_range_size)->mutable_options();

    {
      LocationRecorder index_location(
          extensions_location, 0 /* we fill this in w/ actual index below */,
          &info);
      LocationRecorder location(
          index_location, DescriptorProto::ExtensionRange::kOptionsFieldNumber);
      DO(Consume("["));

      do {
        DO(ParseOption(options, location, containing_file, OPTION_ASSIGNMENT));
      } while (TryConsume(","));

      DO(Consume("]"));
    }

    // Then copy the extension range options to all of the other ranges we've
    // parsed.
    for (int i = old_range_size + 1; i < message->extension_range_size(); i++) {
      message->mutable_extension_range(i)->mutable_options()->CopyFrom(
          *options);
    }
    // and copy source locations to the other ranges, too
    for (int i = old_range_size; i < message->extension_range_size(); i++) {
      for (int j = 0; j < info.location_size(); j++) {
        if (info.location(j).path_size() == range_number_index + 1) {
          // this location's path is up to the extension range index, but
          // doesn't include options; so it's redundant with location above
          continue;
        }
        SourceCodeInfo_Location* dest = source_code_info_->add_location();
        *dest = info.location(j);
        dest->set_path(range_number_index, i);
      }
    }
  }

  DO(ConsumeEndOfDeclaration(";", &extensions_location));
  return true;
}